

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Orphan<capnp::AnyPointer> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnp::AnyPointer>
          (Orphan<capnp::AnyPointer> *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  bool bVar1;
  OrphanBuilder *builder;
  Fault local_58;
  Fault f;
  Type *local_48;
  undefined1 local_40 [8];
  DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Orphan<capnp::DynamicValue> *this_local;
  
  _kjCondition._32_8_ = this;
  local_48 = (Type *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->type);
  f.exception._4_4_ = 0xc;
  kj::_::DebugExpression<capnp::DynamicValue::Type&>::operator==
            ((DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_40,
             (DebugExpression<capnp::DynamicValue::Type&> *)&local_48,
             (Type *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type&,capnp::DynamicValue::Type>&,char_const(&)[21]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x861,FAILED,"type == DynamicValue::ANY_POINTER",
               "_kjCondition,\"Value type mismatch.\"",
               (DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_40,
               (char (*) [21])"Value type mismatch.");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  this->type = UNKNOWN;
  builder = kj::mv<capnp::_::OrphanBuilder>(&this->builder);
  Orphan<capnp::AnyPointer>::Orphan(__return_storage_ptr__,builder);
  return __return_storage_ptr__;
}

Assistant:

Orphan<AnyPointer> Orphan<DynamicValue>::releaseAs<AnyPointer>() {
  KJ_REQUIRE(type == DynamicValue::ANY_POINTER, "Value type mismatch.");
  type = DynamicValue::UNKNOWN;
  return Orphan<AnyPointer>(kj::mv(builder));
}